

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

uint8_t * xml_string_clone(xml_string *s)

{
  size_t __n;
  uint8_t *__dest;
  
  if (s == (xml_string *)0x0) {
    __dest = (uint8_t *)0x0;
  }
  else {
    __n = s->length;
    __dest = (uint8_t *)calloc(__n + 1,1);
    memcpy(__dest,s->buffer,__n);
    __dest[__n] = '\0';
  }
  return __dest;
}

Assistant:

static uint8_t* xml_string_clone(struct xml_string* s) {
	if (!s) {
		return 0;
	}

	uint8_t* clone = calloc(s->length + 1, sizeof(uint8_t));

	xml_string_copy(s, clone, s->length);
	clone[s->length] = 0;

	return clone;
}